

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

int __thiscall gl4cts::TextureFilterMinmax::init(TextureFilterMinmax *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TextureFilterMinmaxParameterQueriesTestCase *this_00;
  TestNode *pTVar1;
  TextureFilterMinmaxSupportTestCase *this_01;
  
  this_00 = (TextureFilterMinmaxParameterQueriesTestCase *)operator_new(0xc0);
  TextureFilterMinmaxParameterQueriesTestCase::TextureFilterMinmaxParameterQueriesTestCase
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(200);
  TextureFilterMinmaxMinificationFilteringTestCase::TextureFilterMinmaxMinificationFilteringTestCase
            ((TextureFilterMinmaxMinificationFilteringTestCase *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(200);
  TextureFilterMinmaxMagnificationFilteringTestCase::
  TextureFilterMinmaxMagnificationFilteringTestCase
            ((TextureFilterMinmaxMagnificationFilteringTestCase *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(200);
  TextureFilterMinmaxMipmapMinificationFilteringTestCase::
  TextureFilterMinmaxMipmapMinificationFilteringTestCase
            ((TextureFilterMinmaxMipmapMinificationFilteringTestCase *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (TextureFilterMinmaxSupportTestCase *)operator_new(0xc0);
  TextureFilterMinmaxSupportTestCase::TextureFilterMinmaxSupportTestCase
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void TextureFilterMinmax::init()
{
	addChild(new TextureFilterMinmaxParameterQueriesTestCase(m_context));
	addChild(new TextureFilterMinmaxMinificationFilteringTestCase(m_context));
	addChild(new TextureFilterMinmaxMagnificationFilteringTestCase(m_context));
	addChild(new TextureFilterMinmaxMipmapMinificationFilteringTestCase(m_context));
	addChild(new TextureFilterMinmaxSupportTestCase(m_context));
}